

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

bool aggress_prog_arangird_regthor(CHAR_DATA *mob,CHAR_DATA *attacker)

{
  CHAR_DATA *arg1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  bool bVar1;
  CHAR_DATA *demon;
  bool in_stack_000000bf;
  CHAR_DATA *in_stack_000000c0;
  char *in_stack_000011e0;
  CHAR_DATA *in_stack_000011e8;
  char *in_stack_00002488;
  CHAR_DATA *in_stack_00002490;
  void *in_stack_ffffffffffffffd8;
  
  arg1 = get_char_room(in_stack_000011e8,in_stack_000011e0);
  bVar1 = arg1 != (CHAR_DATA *)0x0;
  if (bVar1) {
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    extract_char(in_stack_000000c0,in_stack_000000bf);
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    do_murder(in_stack_00002490,in_stack_00002488);
  }
  return bVar1;
}

Assistant:

bool aggress_prog_arangird_regthor(CHAR_DATA *mob, CHAR_DATA *attacker)
{
	CHAR_DATA *demon;

	if ((demon = get_char_room(mob, "ertruza")) == nullptr)
		return false;

	act("A look of horror crosses $n's face as $s concentration falters.", mob, 0, demon, TO_ALL);
	act("The barrier surrounding $N flickers and fades, and $n shrieks!", mob, 0, demon, TO_ALL);
	act("Roaring with anger, $n grabs his former captor and devours $M whole!", demon, 0, mob, TO_ALL);

	extract_char(mob, true);

	act("$n then turns you and strikes!", demon, 0, attacker, TO_CHAR);
	act("$n then turns to $N and strikes!", demon, 0, attacker, TO_ROOM);
	do_murder(demon, attacker->name);

	return true;
}